

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v10::basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::grow
          (basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *this,size_t size)

{
  size_t __t;
  uint *puVar1;
  pointer __result;
  size_t __n;
  uint *local_70;
  uint *new_data;
  uint *old_data;
  size_t new_capacity;
  size_t old_capacity;
  size_t max_size;
  size_t size_local;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *this_local;
  
  v10::detail::abort_fuzzing_if(5000 < size);
  local_70 = (uint *)std::allocator_traits<std::allocator<unsigned_int>_>::max_size
                               ((allocator_type *)this);
  __t = v10::detail::buffer<unsigned_int>::capacity(&this->super_buffer<unsigned_int>);
  puVar1 = (uint *)(__t + (__t >> 1));
  old_data = (uint *)size;
  if ((size <= puVar1) && (old_data = puVar1, local_70 < puVar1)) {
    if (local_70 < size) {
      local_70 = (uint *)size;
    }
    old_data = local_70;
  }
  puVar1 = v10::detail::buffer<unsigned_int>::data(&this->super_buffer<unsigned_int>);
  __result = std::allocator_traits<std::allocator<unsigned_int>_>::allocate
                       ((allocator_type *)this,(size_type)old_data);
  v10::detail::buffer<unsigned_int>::size(&this->super_buffer<unsigned_int>);
  __n = v10::detail::buffer<unsigned_int>::size(&this->super_buffer<unsigned_int>);
  std::uninitialized_copy_n<unsigned_int*,unsigned_long,unsigned_int*>(puVar1,__n,__result);
  v10::detail::buffer<unsigned_int>::set
            (&this->super_buffer<unsigned_int>,__result,(size_t)old_data);
  if (puVar1 != this->store_) {
    __gnu_cxx::new_allocator<unsigned_int>::deallocate
              ((new_allocator<unsigned_int> *)this,puVar1,__t);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void grow(size_t size) override {
    detail::abort_fuzzing_if(size > 5000);
    const size_t max_size = std::allocator_traits<Allocator>::max_size(alloc_);
    size_t old_capacity = this->capacity();
    size_t new_capacity = old_capacity + old_capacity / 2;
    if (size > new_capacity)
      new_capacity = size;
    else if (new_capacity > max_size)
      new_capacity = size > max_size ? size : max_size;
    T* old_data = this->data();
    T* new_data =
        std::allocator_traits<Allocator>::allocate(alloc_, new_capacity);
    // Suppress a bogus -Wstringop-overflow in gcc 13.1 (#3481).
    detail::assume(this->size() <= new_capacity);
    // The following code doesn't throw, so the raw pointer above doesn't leak.
    std::uninitialized_copy_n(old_data, this->size(), new_data);
    this->set(new_data, new_capacity);
    // deallocate must not throw according to the standard, but even if it does,
    // the buffer already uses the new storage and will deallocate it in
    // destructor.
    if (old_data != store_) alloc_.deallocate(old_data, old_capacity);
  }